

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

MIR_insn_t_conflict create_label(MIR_context_t ctx,int64_t label_num)

{
  MIR_insn_t_conflict pMVar1;
  MIR_insn_t_conflict extraout_RAX;
  char *__ptr;
  
  pMVar1 = (MIR_insn_t_conflict)malloc(0x50);
  if (pMVar1 != (MIR_insn_t_conflict)0x0) {
    pMVar1->data = (void *)0x0;
    pMVar1->ops[0].data = (void *)0x0;
    *(undefined2 *)&pMVar1->ops[0].field_0x8 = 3;
    pMVar1->ops[0].u.i = label_num;
    *(undefined8 *)&pMVar1->field_0x18 = 0xb4;
    return pMVar1;
  }
  __ptr = "Not enough memory for insn creation";
  (*ctx->error_func)(MIR_alloc_error,"Not enough memory for insn creation");
  free(__ptr);
  return extraout_RAX;
}

Assistant:

static MIR_insn_t create_label (MIR_context_t ctx, int64_t label_num) {
  MIR_insn_t insn = new_insn1 (ctx, MIR_LABEL);

  insn->ops[0] = MIR_new_int_op (ctx, label_num);
  insn->nops = 0;
  return insn;
}